

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O1

int nn_xreq_recv(nn_sockbase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  uint uVar1;
  size_t sVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  int iVar5;
  
  uVar1 = nn_fq_recv((nn_fq *)&self[0x19].sock,msg,(nn_pipe **)0x0);
  iVar5 = -0xb;
  if (uVar1 == 0xfffffff5) {
    return -0xb;
  }
  if ((int)uVar1 < 0) {
    nn_xreq_recv_cold_2();
LAB_00125189:
    nn_msg_term(msg);
  }
  else {
    if ((uVar1 & 2) == 0) {
      self_00 = &msg->body;
      sVar2 = nn_chunkref_size(self_00);
      if (sVar2 < 4) goto LAB_00125189;
      sVar2 = nn_chunkref_size(&msg->sphdr);
      if (sVar2 != 0) {
        nn_xreq_recv_cold_1();
      }
      nn_chunkref_term(&msg->sphdr);
      nn_chunkref_init(&msg->sphdr,4);
      puVar3 = (undefined4 *)nn_chunkref_data(&msg->sphdr);
      puVar4 = (undefined4 *)nn_chunkref_data(self_00);
      *puVar3 = *puVar4;
      nn_chunkref_trim(self_00,4);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int nn_xreq_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;

    rc = nn_fq_recv (&nn_cont (self, struct nn_xreq, sockbase)->fq, msg, NULL);
    if (rc == -EAGAIN)
        return -EAGAIN;
    errnum_assert (rc >= 0, -rc);

    if (!(rc & NN_PIPE_PARSED)) {

        /*  Ignore malformed replies. */
        if (nn_slow (nn_chunkref_size (&msg->body) < sizeof (uint32_t))) {
            nn_msg_term (msg);
            return -EAGAIN;
        }

        /*  Split the message into the header and the body. */
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), nn_chunkref_data (&msg->body),
            sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, sizeof (uint32_t));
    }

    return 0;
}